

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int saveCursorKey(BtCursor *pCur)

{
  u8 uVar1;
  int iVar2;
  uchar *pBuf;
  int iVar3;
  ulong n;
  
  uVar1 = pCur->curIntKey;
  getCellInfo(pCur);
  if (uVar1 == '\0') {
    n = (ulong)(pCur->info).nPayload;
    pCur->nKey = n;
    pBuf = (uchar *)sqlite3Malloc(n);
    if (pBuf == (uchar *)0x0) {
      iVar3 = 7;
    }
    else {
      iVar3 = 0;
      iVar2 = accessPayload(pCur,0,(u32)pCur->nKey,pBuf,0);
      if (iVar2 == 0) {
        pCur->pKey = pBuf;
      }
      else {
        sqlite3_free(pBuf);
        iVar3 = iVar2;
      }
    }
  }
  else {
    pCur->nKey = (pCur->info).nKey;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int saveCursorKey(BtCursor *pCur){
  int rc = SQLITE_OK;
  assert( CURSOR_VALID==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->curIntKey ){
    /* Only the rowid is required for a table btree */
    pCur->nKey = sqlite3BtreeIntegerKey(pCur);
  }else{
    /* For an index btree, save the complete key content */
    void *pKey;
    pCur->nKey = sqlite3BtreePayloadSize(pCur);
    pKey = sqlite3Malloc( pCur->nKey );
    if( pKey ){
      rc = sqlite3BtreePayload(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  assert( !pCur->curIntKey || !pCur->pKey );
  return rc;
}